

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactWrench.cpp
# Opt level: O1

string * __thiscall
iDynTree::LinkContactWrenches::toString_abi_cxx11_
          (string *__return_storage_ptr__,LinkContactWrenches *this,Model *model)

{
  pointer pvVar1;
  pointer pCVar2;
  string *psVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  stringstream ss;
  string local_220;
  LinkIndex local_200;
  string local_1f8;
  string *local_1d8;
  Model *local_1d0;
  long local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = __return_storage_ptr__;
  local_1d0 = model;
  std::__cxx11::stringstream::stringstream(local_1b8);
  lVar4 = (long)(this->m_linkContactWrenches).
                super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_linkContactWrenches).
                super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 != 0) {
    local_1c8 = (lVar4 >> 3) * -0x5555555555555555;
    local_1c8 = local_1c8 + (ulong)(local_1c8 == 0);
    lVar4 = 0;
    do {
      pvVar1 = (this->m_linkContactWrenches).
               super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1c0 = *(pointer *)
                   &pvVar1[lVar4].
                    super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                    ._M_impl;
      pCVar2 = *(pointer *)
                ((long)&pvVar1[lVar4].
                        super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                        ._M_impl + 8);
      lVar6 = (long)pCVar2 - (long)local_1c0;
      local_200 = lVar4;
      if (lVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"Contact wrenches on link ",0x19);
        Model::getLinkName_abi_cxx11_(&local_220,local_1d0,local_200);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,":",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_dataplus._M_p != &local_220.field_2) {
          operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
        }
        if (pCVar2 != local_1c0) {
          lVar6 = (lVar6 >> 3) * 0x2e8ba2e8ba2e8ba3;
          lVar6 = lVar6 + (ulong)(lVar6 == 0);
          lVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Wrench contact with pos: ",0x19);
            iDynTree::Position::toString_abi_cxx11_();
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,",wrench: ",9);
            SpatialVector<iDynTree::SpatialForceVector>::toString_abi_cxx11_
                      (&local_1f8,
                       (SpatialVector<iDynTree::SpatialForceVector> *)
                       (*(long *)&(this->m_linkContactWrenches).
                                  super__Vector_base<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>,_std::allocator<std::vector<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar4].
                                  super__Vector_base<iDynTree::ContactWrench,_std::allocator<iDynTree::ContactWrench>_>
                                  ._M_impl + lVar7 + 0x20));
            poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar5,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_220._M_dataplus._M_p != &local_220.field_2) {
              operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1
                             );
            }
            lVar7 = lVar7 + 0x58;
            lVar6 = lVar6 + -1;
          } while (lVar6 != 0);
        }
      }
      lVar4 = local_200 + 1;
    } while (lVar4 != local_1c8);
  }
  psVar3 = local_1d8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar3;
}

Assistant:

std::string LinkContactWrenches::toString(const Model& model) const
{
    std::stringstream ss;

    size_t nrOfLinks = m_linkContactWrenches.size();
    for(size_t l=0; l < nrOfLinks; l++)
    {
        size_t nrOfContacts = this->getNrOfContactsForLink(l);

        if( nrOfContacts > 0 )
        {
            ss << "Contact wrenches on link " << model.getLinkName(l) << ":" << std::endl;
            for(size_t c=0; c < nrOfContacts; c++ )
            {
                ss << "Wrench contact with pos: " << this->contactWrench(l,c).contactPoint().toString() << ","
                                          "wrench: " << this->contactWrench(l,c).contactWrench().toString() << std::endl;
            }
        }
    }
    return ss.str();
}